

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspFacade::SolveStrategy::detachAlgo
          (SolveStrategy *this,bool more,int nException,int state)

{
  bool bVar1;
  undefined1 uVar2;
  SolveData *pSVar3;
  Model *pMVar4;
  int in_ECX;
  byte extraout_DL;
  int in_EDX;
  Subsystem in_ESI;
  ClaspFacade *in_RDI;
  double tEnd;
  double dVar5;
  exception *e;
  Summary *in_stack_fffffffffffffee0;
  ClaspFacade *in_stack_fffffffffffffee8;
  SharedContext *this_00;
  double dStack_110;
  Result RStack_ea;
  ClaspFacade *pCVar6;
  Summary *in_stack_ffffffffffffff38;
  SolveAlgorithm *in_stack_ffffffffffffff40;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffff48;
  Summary *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  pointer pPVar7;
  size_type ns;
  Summary *in_stack_ffffffffffffff70;
  ClaspFacade *in_stack_ffffffffffffff78;
  Literal local_50;
  Result local_4a;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Result local_28;
  Result local_26;
  int local_14;
  int local_10;
  byte local_9;
  
  ns = (size_type)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_9 = (byte)in_ESI & 1;
  if (in_EDX == 1) {
    __cxa_rethrow();
    pCVar6 = in_RDI;
    bVar1 = solved(in_stack_fffffffffffffee8);
    if (!bVar1) {
      tEnd = RealTime::getTime();
      pSVar3 = SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)
                          0x121fb8);
      pSVar3->solved = true;
      dVar5 = diffTime(tEnd,(in_RDI->step_).totalTime);
      (in_RDI->step_).totalTime = dVar5;
      dVar5 = ProcessTime::getTime();
      dVar5 = diffTime(dVar5,(in_RDI->step_).cpuTime);
      (in_RDI->step_).cpuTime = dVar5;
      dVar5 = (in_RDI->step_).solveTime;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        dVar5 = diffTime(tEnd,(in_RDI->step_).solveTime);
        (in_RDI->step_).solveTime = dVar5;
        if ((extraout_DL & 1) == 0) {
          dStack_110 = 0.0;
        }
        else {
          dStack_110 = diffTime(tEnd,(in_RDI->step_).unsatTime);
        }
        (in_RDI->step_).unsatTime = dStack_110;
      }
      if ((extraout_DL & 1) == 0) {
        RStack_ea.signal = (uint8)in_ESI;
        RStack_ea.flags = (in_RDI->step_).numEnum != 0;
      }
      else {
        uVar2 = 2;
        if ((in_RDI->step_).numEnum != 0) {
          uVar2 = 1;
        }
        RStack_ea = (Result)(CONCAT11((uint8)in_ESI,uVar2) | 4);
      }
      if (in_ESI != subsystem_facade) {
        RStack_ea = (Result)((ushort)RStack_ea | 8);
      }
      (in_RDI->step_).result = RStack_ea;
      bVar1 = SolveResult::sat((SolveResult *)0x122110);
      if (((bVar1) &&
          (pMVar4 = Summary::model((Summary *)in_stack_fffffffffffffee8),
          (*(uint *)&pMVar4->field_0x20 >> 0x1a & 1) != 0)) && ((in_RDI->step_).numOptimal == 0)) {
        (in_RDI->step_).numOptimal = 1;
      }
      updateStats(pCVar6);
      this_00 = &in_RDI->ctx;
      StepReady::StepReady((StepReady *)this_00,in_stack_fffffffffffffee0);
      SharedContext::report(this_00,(Event *)in_stack_fffffffffffffee0);
      SharedContext::report((SharedContext *)pCVar6,in_ESI);
    }
    ClaspFacade::result(in_RDI);
    return;
  }
  local_14 = in_ECX;
  local_10 = in_EDX;
  switch(in_ECX) {
  case 0:
    local_14 = in_ECX + 1;
    if (in_EDX == 0) {
      SolveAlgorithm::stop(in_stack_ffffffffffffff40);
    }
    else {
      SolveAlgorithm::stop(in_stack_ffffffffffffff40);
    }
  case 1:
    local_14 = local_14 + 1;
    if (local_10 == 0) {
      pCVar6 = (ClaspFacade *)(in_RDI->ctx).satPrepro.ptr_;
      std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffff48);
      local_28 = stopStep(pCVar6,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
    }
    else {
      std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffff48);
      local_26 = stopStep(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
    }
  case 2:
    local_14 = local_14 + 1;
    if ((in_RDI->ctx).output.preds_.ebo_.buf != (pointer)0x0) {
      if (local_10 == 0) {
        pPVar7 = (in_RDI->ctx).output.preds_.ebo_.buf;
        in_stack_ffffffffffffff60 = summary((ClaspFacade *)(in_RDI->ctx).satPrepro.ptr_);
        StepReady::StepReady((StepReady *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        (**(code **)((pPVar7->name).ref_ + 0x20))(pPVar7,local_48);
      }
      else {
        pPVar7 = (in_RDI->ctx).output.preds_.ebo_.buf;
        in_stack_ffffffffffffff70 = summary((ClaspFacade *)(in_RDI->ctx).satPrepro.ptr_);
        StepReady::StepReady((StepReady *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        (**(code **)((pPVar7->name).ref_ + 0x20))(pPVar7,local_38);
        ns = (size_type)((ulong)pPVar7 >> 0x20);
      }
    }
  case 3:
    local_14 = 0xffffffff;
    local_4a = ClaspFacade::result((ClaspFacade *)(in_RDI->ctx).satPrepro.ptr_);
    *(Result *)((long)&(in_RDI->ctx).output.proj_.ebo_.buf + 4) = local_4a;
    Literal::Literal(&local_50);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               in_stack_ffffffffffffff70,ns,(Literal *)in_stack_ffffffffffffff60);
    (*(in_RDI->super_ModelHandler)._vptr_ModelHandler[4])(in_RDI,3);
  default:
    return;
  }
}

Assistant:

void ClaspFacade::SolveStrategy::detachAlgo(bool more, int nException, int state) {
#define PROTECT(ec, X) if ((ec)) try { X; } catch (...) {} else X
	try {
		if (nException == 1) { throw; }
		switch (state) {
			case 0: ++state; PROTECT(nException, algo_->stop());  // FALLTHROUGH
			case 1: ++state; PROTECT(nException, facade_->stopStep(signal_, !more));  // FALLTHROUGH
			case 2: ++state; if (handler_) { PROTECT(nException, handler_->onEvent(StepReady(facade_->summary()))); }   // FALLTHROUGH
			case 3: state = -1;
				result_ = facade_->result();
				facade_->assume_.resize(aTop_);
				doNotify(event_detach);
			default:	break;
		}
	}
	catch (...) {
		error_ = "Operation failed: ";
		if (!signal_)    { signal_ = SIGERROR; }
		if (state != -1) { detachAlgo(more, 2, state); }
		if ((mode_ & SolveMode_t::Async) == 0) {
			error_ += "exception thrown";
			throw;
		}
		try { throw; }
		catch (const std::exception& e) { error_ = e.what(); }
		catch (...)                     { error_ = "unknown error"; }
	}
}